

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint64 value)

{
  deUint8 local_28;
  deUint8 local_27;
  deUint8 local_26;
  deUint8 local_25;
  deUint8 local_24;
  deUint8 local_23;
  deUint8 local_22;
  deUint8 local_21;
  deUint8 data [8];
  deUint64 val;
  deUint64 value_local;
  SeedBuilder *builder_local;
  
  data = (deUint8  [8])(value ^ 0x40bd2fb8629a468f);
  local_28 = data[0];
  local_27 = data[1];
  local_26 = data[2];
  local_25 = data[3];
  local_24 = data[4];
  local_23 = data[5];
  local_22 = data[6];
  local_21 = data[7];
  SeedBuilder::feed(builder,8,&local_28);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint64 value)
{
	const deUint64	val		= value ^ 4664937258000467599ull;
	const deUint8	data[]	=
	{
		(deUint8)(val & 0xFFu),
		(deUint8)((val >> 8) & 0xFFu),
		(deUint8)((val >> 16) & 0xFFu),
		(deUint8)((val >> 24) & 0xFFu),

		(deUint8)((val >> 32) & 0xFFu),
		(deUint8)((val >> 40) & 0xFFu),
		(deUint8)((val >> 48) & 0xFFu),
		(deUint8)((val >> 56) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}